

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls.c
# Opt level: O1

mbedtls_pk_type_t mbedtls_ssl_pk_alg_from_sig(uchar sig)

{
  mbedtls_pk_type_t mVar1;
  undefined3 in_register_00000039;
  
  mVar1 = (uint)(CONCAT31(in_register_00000039,sig) == 3) << 2;
  if (CONCAT31(in_register_00000039,sig) == 1) {
    mVar1 = MBEDTLS_PK_RSA;
  }
  return mVar1;
}

Assistant:

mbedtls_pk_type_t mbedtls_ssl_pk_alg_from_sig( unsigned char sig )
{
    switch( sig )
    {
#if defined(MBEDTLS_RSA_C)
        case MBEDTLS_SSL_SIG_RSA:
            return( MBEDTLS_PK_RSA );
#endif
#if defined(MBEDTLS_ECDSA_C)
        case MBEDTLS_SSL_SIG_ECDSA:
            return( MBEDTLS_PK_ECDSA );
#endif
        default:
            return( MBEDTLS_PK_NONE );
    }
}